

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_part.c
# Opt level: O0

int cmime_part_to_file(CMimePart_T *part,char *filename)

{
  int iVar1;
  char *pcVar2;
  FILE *__s;
  size_t __size;
  char local_58 [8];
  char qp [17];
  char local_3f [7];
  char *pcStack_38;
  char base64 [7];
  char *decoded_str;
  char *encoding;
  FILE *fp;
  int retval;
  char *filename_local;
  CMimePart_T *part_local;
  
  fp._4_4_ = 0;
  pcStack_38 = (char *)0x0;
  builtin_strncpy(local_3f,"base64",7);
  builtin_strncpy(local_58,"quoted-p",8);
  builtin_strncpy(qp,"rintable",9);
  if (part == (CMimePart_T *)0x0) {
    __assert_fail("part",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_part.c"
                  ,0x16e,"int cmime_part_to_file(CMimePart_T *, char *)");
  }
  if (filename == (char *)0x0) {
    __assert_fail("filename",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_part.c"
                  ,0x16f,"int cmime_part_to_file(CMimePart_T *, char *)");
  }
  pcVar2 = cmime_part_get_content_transfer_encoding(part);
  if (pcVar2 == (char *)0x0) {
    asprintf(&stack0xffffffffffffffc8,"%s",part->content);
  }
  else {
    iVar1 = my_strmatch(pcVar2,local_58);
    if (iVar1 == 0) {
      pcStack_38 = cmime_qp_decode_text(part->content);
    }
    else {
      iVar1 = my_strmatch(pcVar2,local_3f);
      if (iVar1 == 0) {
        pcStack_38 = cmime_base64_decode_string(part->content);
      }
      else {
        asprintf(&stack0xffffffffffffffc8,"%s",part->content);
      }
    }
  }
  __s = fopen(filename,"wb");
  pcVar2 = pcStack_38;
  if (__s == (FILE *)0x0) {
    perror("libcmime: error opening file");
    fp._4_4_ = -3;
  }
  else {
    __size = strlen(pcStack_38);
    fwrite(pcVar2,__size,1,__s);
    iVar1 = fclose(__s);
    if (iVar1 != 0) {
      perror("libcmime: error closing file");
    }
  }
  if (pcStack_38 != (char *)0x0) {
    free(pcStack_38);
  }
  return fp._4_4_;
}

Assistant:

int cmime_part_to_file(CMimePart_T *part, char *filename) {
    int retval = 0;
    FILE *fp = NULL;
    char *encoding = NULL;
    char *decoded_str = NULL;

    // todo: extend for x-uuencode
    const char base64[] = "base64";
    const char qp[] = "quoted-printable";

    assert(part);
    assert(filename);

    // check for encodings
    encoding = cmime_part_get_content_transfer_encoding(part);

    if(encoding == NULL) {
        asprintf(&decoded_str,"%s",part->content);
    } else if (my_strmatch(encoding,qp)==0) {
        decoded_str = cmime_qp_decode_text(part->content);
    } else if (my_strmatch(encoding,base64)==0) {
        decoded_str = cmime_base64_decode_string(part->content);  
    } else {
        asprintf(&decoded_str,"%s",part->content);
    }
    fp = fopen(filename, "wb");
    if(fp != NULL) {
        fwrite(decoded_str,strlen(decoded_str),1,fp);
        if (fclose(fp)!=0)
            perror("libcmime: error closing file");   
    } else {
        perror("libcmime: error opening file");
        retval = -3; /* failed to open file */ 
    }
    // some cleanup
    // RJW: Do NOT free encoding! It's a header and will be freed later.
    // if(encoding!=NULL)
    //    free(encoding);
    if(decoded_str!=NULL)
        free(decoded_str);

    return retval;
}